

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

void __thiscall
JsrtDebuggerObjectProperty::~JsrtDebuggerObjectProperty(JsrtDebuggerObjectProperty *this)

{
  ~JsrtDebuggerObjectProperty(this);
  operator_delete(this);
  return;
}

Assistant:

JsrtDebuggerObjectProperty::~JsrtDebuggerObjectProperty()
{
    if (this->objectDisplay != nullptr)
    {
        HeapDelete(this->objectDisplay);
        this->objectDisplay = nullptr;
    }

    if (this->walkerRef != nullptr)
    {
        HeapDelete(this->walkerRef);
        this->walkerRef = nullptr;
    }
}